

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setseed.cpp
# Opt level: O1

void duckdb::SetSeedFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  double input;
  data_ptr_t pdVar1;
  bool bVar2;
  BoundFunctionExpression *pBVar3;
  pointer pFVar4;
  reference this;
  RandomEngine *this_00;
  InvalidInputException *this_01;
  ulong uVar5;
  string local_50;
  
  pBVar3 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  pFVar4 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&pBVar3->bind_info);
  this = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  Vector::Flatten(this,args->count);
  pdVar1 = this->data;
  this_00 = RandomEngine::Get((ClientContext *)pFVar4[1]._vptr_FunctionData);
  if (args->count != 0) {
    uVar5 = 0;
    do {
      input = *(double *)(pdVar1 + uVar5 * 8);
      if (1.0 < ABS(input)) {
LAB_01c5c67e:
        this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"SETSEED accepts seed values between -1.0 and 1.0, inclusive"
                   ,"");
        InvalidInputException::InvalidInputException(this_01,&local_50);
        __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      bVar2 = Value::IsNan<double>(input);
      if (bVar2) goto LAB_01c5c67e;
      RandomEngine::SetSeed
                (this_00,(long)((*(double *)(pdVar1 + uVar5 * 8) + 1.0) * 2147483647.0) & 0xffffffff
                );
      uVar5 = uVar5 + 1;
    } while (uVar5 < args->count);
  }
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void SetSeedFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<SetseedBindData>();
	auto &input = args.data[0];
	input.Flatten(args.size());

	auto input_seeds = FlatVector::GetData<double>(input);
	uint32_t half_max = NumericLimits<uint32_t>::Maximum() / 2;

	auto &random_engine = RandomEngine::Get(info.context);
	for (idx_t i = 0; i < args.size(); i++) {
		if (input_seeds[i] < -1.0 || input_seeds[i] > 1.0 || Value::IsNan(input_seeds[i])) {
			throw InvalidInputException("SETSEED accepts seed values between -1.0 and 1.0, inclusive");
		}
		auto norm_seed = LossyNumericCast<uint32_t>((input_seeds[i] + 1.0) * half_max);
		random_engine.SetSeed(norm_seed);
	}

	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	ConstantVector::SetNull(result, true);
}